

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btVoronoiSimplexSolver.cpp
# Opt level: O1

void __thiscall btVoronoiSimplexSolver::reset(btVoronoiSimplexSolver *this)

{
  btUsageBitfield *pbVar1;
  
  this->m_cachedValidClosest = false;
  this->m_numVertices = 0;
  this->m_needsUpdate = true;
  (this->m_lastW).m_floats[0] = 1e+18;
  (this->m_lastW).m_floats[1] = 1e+18;
  (this->m_lastW).m_floats[2] = 1e+18;
  (this->m_lastW).m_floats[3] = 0.0;
  (this->m_cachedBC).m_barycentricCoords[0] = 0.0;
  (this->m_cachedBC).m_barycentricCoords[1] = 0.0;
  (this->m_cachedBC).m_barycentricCoords[2] = 0.0;
  (this->m_cachedBC).m_barycentricCoords[3] = 0.0;
  (this->m_cachedBC).m_degenerate = false;
  pbVar1 = &(this->m_cachedBC).m_usedVertices;
  *(byte *)pbVar1 = *(byte *)pbVar1 & 0xf0;
  return;
}

Assistant:

void btVoronoiSimplexSolver::reset()
{
	m_cachedValidClosest = false;
	m_numVertices = 0;
	m_needsUpdate = true;
	m_lastW = btVector3(btScalar(BT_LARGE_FLOAT),btScalar(BT_LARGE_FLOAT),btScalar(BT_LARGE_FLOAT));
	m_cachedBC.reset();
}